

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

positionTy * __thiscall positionTy::operator|=(positionTy *this,positionTy *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  posFlagsTy pVar7;
  int iVar8;
  positionTy *ppVar9;
  LTError *this_00;
  ulong uVar10;
  double dVar11;
  
  if ((((ushort)pos->f ^ (ushort)this->f) & 0xc00) == 0) {
    dVar11 = HeadingAvg(this->_head,pos->_head,(double)this->mergeCount,(double)pos->mergeCount);
    dVar1 = this->_alt;
    dVar2 = this->_pitch;
    dVar3 = pos->_alt;
    dVar4 = pos->_pitch;
    dVar5 = this->_roll;
    dVar6 = pos->_roll;
    operator*=(this,(double)this->mergeCount);
    operator+=(this,pos);
    iVar8 = this->mergeCount + 1;
    this->mergeCount = iVar8;
    operator*=(this,1.0 / (double)iVar8);
    this->_head = dVar11;
    if (NAN(this->_alt)) {
      uVar10 = -(ulong)NAN(dVar1);
      this->_alt = (double)(~uVar10 & (ulong)dVar1 | (ulong)dVar3 & uVar10);
    }
    if (NAN(this->_pitch)) {
      uVar10 = -(ulong)NAN(dVar2);
      this->_pitch = (double)(~uVar10 & (ulong)dVar2 | (ulong)dVar4 & uVar10);
    }
    if (NAN(this->_roll)) {
      uVar10 = -(ulong)NAN(dVar5);
      this->_roll = (double)(~uVar10 & (ulong)dVar5 | (ulong)dVar6 & uVar10);
    }
    pVar7 = this->f;
    if (((ushort)pVar7 & 0x7f) == 0) {
      pVar7 = (posFlagsTy)((ushort)pVar7 | (ushort)pos->f & 0x7f);
      this->f = pVar7;
    }
    if ((((ushort)pos->f ^ (ushort)pVar7) & 0x300) != 0) {
      pVar7 = (posFlagsTy)((ushort)pVar7 & 0xfcff);
      this->f = pVar7;
    }
    this->f = (posFlagsTy)((ushort)pVar7 & 0x8f7f);
    this->edgeIdx = 0xffffffffffffffff;
    ppVar9 = normalize(this);
    return ppVar9;
  }
  this_00 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                   ,0x134,"operator|=",logFATAL,"ASSERT FAILED: %s",
                   "f.unitCoord == pos.f.unitCoord && f.unitAngle == pos.f.unitAngle");
  __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

positionTy& positionTy::operator |= (const positionTy& pos)
{
    LOG_ASSERT(f.unitCoord == pos.f.unitCoord && f.unitAngle == pos.f.unitAngle);
    // heading needs special treatment
    // (also removes nan value if one of the headings is nan)
    const double h = HeadingAvg(heading(), pos.heading(), mergeCount, pos.mergeCount);
    // take into account how many other objects made up the current pos! ("* count")

    // Special handling for possible NAN values: If NAN on either side then the other wins
    double prev_alt = std::isnan(alt_m()) ? pos.alt_m() : alt_m();
    double prev_ptc = std::isnan(pitch()) ? pos.pitch() : pitch();
    double prev_rol = std::isnan(roll())  ? pos.roll()  : roll();

	// previous implementation:    v = (v * mergeCount + pos.v) / (mergeCount+1);
    (*this *= mergeCount) += pos;
    ++mergeCount;
    *this *= 1.0 / mergeCount;

    heading() = h;
    
    // Handle NAN cases
    if (std::isnan(alt_m())) alt_m() = prev_alt;
    if (std::isnan(pitch())) pitch() = prev_ptc;
    if (std::isnan(roll()))  roll()  = prev_rol;

    // any special flight phase? shall survive
    // (if both pos have special flight phases then ours survives)
    if (!f.flightPhase)
        f.flightPhase = pos.f.flightPhase;
    
    // ground status: if different, then the new one is likely off ground,
    //                but we have it determined soon
    if (f.onGrnd != pos.f.onGrnd)
        f.onGrnd = GND_UNKNOWN;       // IsOnGnd() will return false for this!
    
    // Special Pos and other location flags need to be re-evaluated
    f.bHeadFixed = false;
    f.specialPos = SPOS_NONE;
    f.bCutCorner = false;
    edgeIdx      = EDGE_UNKNOWN;
    
    return normalize();
}